

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_index_build(char *fn,int min_shift)

{
  htsExactFormat hVar1;
  uint uVar2;
  BGZF *fp;
  uint8_t *__ptr;
  int iVar3;
  htsFile *fp_00;
  bam_hdr_t *h;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  hts_idx_t *idx;
  bam1_t *b;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int n_lvls;
  
  fp_00 = hts_open(fn,"r");
  if (fp_00 == (htsFile *)0x0) {
    iVar3 = -1;
  }
  else {
    hVar1 = (fp_00->format).format;
    iVar3 = -1;
    if (hVar1 == bam) {
      fp = (fp_00->fp).bgzf;
      h = bam_hdr_read(fp);
      uVar2 = h->n_targets;
      if (min_shift < 1) {
        n_lvls = 5;
        iVar9 = 1;
        iVar3 = 0xe;
      }
      else {
        if ((int)uVar2 < 1) {
          lVar6 = 0x100;
        }
        else {
          uVar7 = 0;
          uVar4 = 0;
          do {
            uVar5 = (ulong)h->target_len[uVar7];
            if (h->target_len[uVar7] < uVar4) {
              uVar5 = uVar4;
            }
            uVar7 = uVar7 + 1;
            uVar4 = uVar5;
          } while (uVar2 != uVar7);
          lVar6 = uVar5 + 0x100;
        }
        lVar8 = (long)(1 << ((byte)min_shift & 0x1f));
        iVar9 = 0;
        n_lvls = 0;
        iVar3 = min_shift;
        if (lVar8 < lVar6) {
          iVar9 = 0;
          n_lvls = 0;
          do {
            n_lvls = n_lvls + 1;
            lVar8 = lVar8 * 8;
          } while (lVar8 < lVar6);
        }
      }
      idx = hts_idx_init(uVar2,iVar9,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10,
                         iVar3,n_lvls);
      bam_hdr_destroy(h);
      b = (bam1_t *)calloc(1,0x38);
      do {
        iVar3 = bam_read1(fp,b);
        if (iVar3 < 0) {
          hts_idx_finish(idx,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
          bam_destroy1(b);
          iVar3 = -1;
          if (idx != (hts_idx_t *)0x0) {
            hts_idx_save(idx,fn,(uint)(min_shift < 1));
            hts_idx_destroy(idx);
            iVar3 = 0;
          }
          goto LAB_0013c9bc;
        }
        uVar4 = *(ulong *)&(b->core).field_0x8;
        __ptr = b->data;
        iVar3 = 0;
        if (uVar4 >> 0x30 != 0) {
          uVar7 = 0;
          iVar3 = 0;
          do {
            uVar2 = *(uint *)(__ptr + uVar7 * 4 + (uVar4 >> 0x18 & 0xff));
            iVar3 = iVar3 + (uVar2 >> 4 &
                            (int)((0x3c1a7U >> ((char)uVar2 * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
            uVar7 = uVar7 + 1;
          } while (uVar4 >> 0x30 != uVar7);
        }
        iVar9 = (b->core).pos;
        iVar3 = hts_idx_push(idx,(b->core).tid,iVar9,iVar3 + (uint)(iVar3 == 0) + iVar9,
                             (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,
                             (uint)((uVar4 >> 0x22 & 1) == 0));
      } while (-1 < iVar3);
      free(__ptr);
      free(b);
      hts_idx_destroy(idx);
      iVar3 = -1;
    }
    else if (hVar1 == cram) {
      iVar3 = cram_index_build((fp_00->fp).cram,fn);
    }
LAB_0013c9bc:
    hts_close(fp_00);
  }
  return iVar3;
}

Assistant:

int bam_index_build(const char *fn, int min_shift)
{
    hts_idx_t *idx;
    htsFile *fp;
    int ret = 0;

    if ((fp = hts_open(fn, "r")) == 0) return -1;
    switch (fp->format.format) {
    case cram:
        ret = cram_index_build(fp->fp.cram, fn);
        break;

    case bam:
        idx = bam_index(fp->fp.bgzf, min_shift);
        if (idx) {
            hts_idx_save(idx, fn, (min_shift > 0)? HTS_FMT_CSI : HTS_FMT_BAI);
            hts_idx_destroy(idx);
        }
        else ret = -1;
        break;

    default:
        ret = -1;
        break;
    }
    hts_close(fp);

    return ret;
}